

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

aiMatrix4x4 * __thiscall
Assimp::Ogre::TransformKeyFrame::Transform
          (aiMatrix4x4 *__return_storage_ptr__,TransformKeyFrame *this)

{
  aiMatrix4x4t<float>::aiMatrix4x4t
            (__return_storage_ptr__,&this->scale,&this->rotation,&this->position);
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 TransformKeyFrame::Transform()
{
    return aiMatrix4x4(scale, rotation, position);
}